

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O1

void maybe_add_to_tempo_map(smf_event_t *event)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  smf_t *smf;
  uchar *puVar4;
  int iVar5;
  smf_tempo_t *psVar6;
  uint uVar7;
  double dVar8;
  
  iVar5 = smf_event_is_metadata(event);
  if (iVar5 != 0) {
    if (event->track == (smf_track_t *)0x0) {
      __assert_fail("event->track != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x82,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    smf = event->track->smf;
    if (smf == (smf_t *)0x0) {
      __assert_fail("event->track->smf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x83,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    if (event->midi_buffer_length < 1) {
      __assert_fail("event->midi_buffer_length >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x84,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    puVar4 = event->midi_buffer;
    if (puVar4[1] == 'Q') {
      uVar7 = (uint)puVar4[5] | (uint)puVar4[4] << 8 | (uint)puVar4[3] << 0x10;
      if (uVar7 == 0) {
        g_log("libsmf",8,"Ignoring invalid tempo change.");
      }
      else {
        psVar6 = new_tempo(smf,event->time_pulses);
        if (psVar6 != (smf_tempo_t *)0x0) {
          psVar6->microseconds_per_quarter_note = uVar7;
        }
      }
      if (uVar7 == 0) {
        return;
      }
    }
    puVar4 = event->midi_buffer;
    if (puVar4[1] == 'X') {
      if (event->midi_buffer_length < 7) {
        g_log("libsmf",8,"Time Signature event seems truncated.");
        return;
      }
      bVar1 = puVar4[3];
      dVar8 = ldexp(1.0,(uint)puVar4[4]);
      bVar2 = event->midi_buffer[5];
      bVar3 = event->midi_buffer[6];
      psVar6 = new_tempo(event->track->smf,event->time_pulses);
      if (psVar6 != (smf_tempo_t *)0x0) {
        psVar6->numerator = (uint)bVar1;
        psVar6->denominator = (int)dVar8;
        psVar6->clocks_per_click = (uint)bVar2;
        psVar6->notes_per_note = (uint)bVar3;
      }
    }
  }
  return;
}

Assistant:

void
maybe_add_to_tempo_map(smf_event_t *event)
{
	if (!smf_event_is_metadata(event))
		return;

	assert(event->track != NULL);
	assert(event->track->smf != NULL);
	assert(event->midi_buffer_length >= 1);

	/* Tempo Change? */
	if (event->midi_buffer[1] == 0x51) {
		int new_tempo = (event->midi_buffer[3] << 16) + (event->midi_buffer[4] << 8) + event->midi_buffer[5];
		if (new_tempo <= 0) {
			g_critical("Ignoring invalid tempo change.");
			return;
		}

		add_tempo(event->track->smf, event->time_pulses, new_tempo);
	}

	/* Time Signature? */
	if (event->midi_buffer[1] == 0x58) {
		int numerator, denominator, clocks_per_click, notes_per_note;

		if (event->midi_buffer_length < 7) {
			g_critical("Time Signature event seems truncated.");
			return;
		}

		numerator = event->midi_buffer[3];
		denominator = (int)pow(2, event->midi_buffer[4]);
		clocks_per_click = event->midi_buffer[5];
		notes_per_note = event->midi_buffer[6];

		add_time_signature(event->track->smf, event->time_pulses, numerator, denominator, clocks_per_click, notes_per_note);
	}

	return;
}